

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTchr.cpp
# Opt level: O0

void __thiscall NaPNTeacher::set_nn(NaPNTeacher *this,NaPNNNUnit *pnNN,uint nSkipFirst)

{
  undefined4 *puVar1;
  void *pvVar2;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  NaNNUnit *in_stack_00000158;
  NaStdBackProp *in_stack_00000160;
  
  NaPetriNode::check_tunable((NaPetriNode *)0x1542c1);
  if (in_RSI == 0) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0;
    __cxa_throw(puVar1,&NaException::typeinfo,0);
  }
  *(long *)(in_RDI + 0x1c0) = in_RSI;
  NaPNNNUnit::need_nn_deck(*(NaPNNNUnit **)(in_RDI + 0x1c0),true,in_EDX);
  if ((*(long *)(in_RDI + 0x1e8) != 0) && (*(long **)(in_RDI + 0x1e8) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x1e8) + 8))();
  }
  pvVar2 = operator_new(0x720);
  NaPNNNUnit::get_nn_unit(*(NaPNNNUnit **)(in_RDI + 0x1c0));
  NaStdBackProp::NaStdBackProp(in_stack_00000160,in_stack_00000158);
  *(void **)(in_RDI + 0x1e8) = pvVar2;
  if (*(long *)(in_RDI + 0x1e8) != 0) {
    return;
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 4;
  __cxa_throw(puVar1,&NaException::typeinfo,0);
}

Assistant:

void
NaPNTeacher::set_nn (NaPNNNUnit* pnNN, unsigned nSkipFirst)
{
    check_tunable();

    if(NULL == pnNN)
	throw(na_null_pointer);

    pnn = pnNN;
    pnn->need_nn_deck(true, nSkipFirst);

    // Create a teacher
    if(NULL != bpe)
        delete bpe;

    // Create teacher and attach NN at the same time
    bpe = new NaStdBackProp(*(pnn->get_nn_unit()));
    //qprop: bpe = new NaQuickProp(*nn);
    if(NULL == bpe)
        throw(na_bad_alloc);
}